

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::IRContext::GetBuiltinInputVarId(IRContext *this,uint32_t builtin)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  uint32_t uVar1;
  iterator iVar2;
  TypeManager *this_01;
  Type *pTVar3;
  Instruction *this_02;
  DefUseManager *this_03;
  DecorationManager *this_04;
  mapped_type *pmVar4;
  Vector *type;
  initializer_list<unsigned_int> init_list;
  uint32_t builtin_local;
  uint32_t local_b8;
  uint local_b4;
  Vector v4float_ty;
  Float float_ty;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_local = builtin;
  if ((this->valid_analyses_ & kAnalysisBuiltinVarId) == kAnalysisNone) {
    ResetBuiltinAnalysis(this);
  }
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->builtin_var_id_map_)._M_h,&builtin_local);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)iVar2.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur + 0xc);
  }
  uVar1 = FindBuiltinInputVar(this,builtin_local);
  if (uVar1 != 0) goto LAB_00205ba9;
  this_01 = get_type_mgr(this);
  if ((builtin_local - 0x29 < 3) || (builtin_local - 7 < 2)) {
    type = &v4float_ty;
    v4float_ty.super_Type.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    v4float_ty.super_Type.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v4float_ty.super_Type.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    v4float_ty.super_Type.kind_ = kInteger;
    v4float_ty.super_Type._36_4_ = 0x20;
    v4float_ty.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
    v4float_ty.element_type_._0_1_ = 0;
    pTVar3 = analysis::TypeManager::GetRegisteredType(this_01,&type->super_Type);
  }
  else {
    if (builtin_local == 0xd) {
      float_ty.super_Type.kind_ = kFloat;
      float_ty.super_Type._36_4_ = 0x20;
      float_ty.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b1af0;
LAB_00205a20:
      float_ty.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      float_ty.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      float_ty.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar3 = analysis::TypeManager::GetRegisteredType(this_01,&float_ty.super_Type);
      uVar1 = 3;
    }
    else {
      if ((builtin_local == 0x14c7) || (builtin_local == 0x1c)) {
        float_ty.super_Type.kind_ = kInteger;
        float_ty.super_Type._36_4_ = 0x20;
        float_ty.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
        goto LAB_00205a20;
      }
      if (builtin_local == 0x1144) {
        float_ty.super_Type.kind_ = kInteger;
        float_ty.super_Type._36_4_ = 0x20;
        float_ty.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
      }
      else {
        if (builtin_local != 0xf) {
          __assert_fail("false && \"unhandled builtin\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp"
                        ,0x388,"uint32_t spvtools::opt::IRContext::GetBuiltinInputVarId(uint32_t)");
        }
        float_ty.super_Type.kind_ = kFloat;
        float_ty.super_Type._36_4_ = 0x20;
        float_ty.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b1af0;
      }
      float_ty.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      float_ty.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      float_ty.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar3 = analysis::TypeManager::GetRegisteredType(this_01,&float_ty.super_Type);
      uVar1 = 4;
    }
    type = (Vector *)&float_ty;
    analysis::Vector::Vector(&v4float_ty,pTVar3,uVar1);
    pTVar3 = analysis::TypeManager::GetRegisteredType(this_01,&v4float_ty.super_Type);
    analysis::Type::~Type(&v4float_ty.super_Type);
  }
  analysis::Type::~Type(&type->super_Type);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_01,pTVar3);
  local_b8 = analysis::TypeManager::FindPointerToType(this_01,uVar1,Input);
  uVar1 = TakeNextId(this);
  this_02 = (Instruction *)operator_new(0x70);
  local_b4 = 1;
  init_list._M_len = 1;
  init_list._M_array = &local_b4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)&float_ty,init_list);
  this_00 = &v4float_ty.super_Type.decorations_;
  v4float_ty.super_Type._vptr_Type =
       (_func_int **)CONCAT44(v4float_ty.super_Type._vptr_Type._4_4_,6);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)this_00,(SmallVector<unsigned_int,_2UL> *)&float_ty);
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             &v4float_ty,&v4float_ty.count_);
  Instruction::Instruction(this_02,this,OpVariable,local_b8,uVar1,(OperandList *)&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)this_00);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&float_ty);
  this_03 = get_def_use_mgr(this);
  analysis::DefUseManager::AnalyzeInstDefUse(this_03,this_02);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            ((IntrusiveNodeBase<spvtools::opt::Instruction> *)this_02,
             (Instruction *)
             ((long)&(((this->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8));
  this_04 = get_decoration_mgr(this);
  analysis::DecorationManager::AddDecorationVal(this_04,uVar1,0xb,builtin_local);
  AddVarToEntryPoints(this,uVar1);
LAB_00205ba9:
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->builtin_var_id_map_,&builtin_local);
  *pmVar4 = uVar1;
  return uVar1;
}

Assistant:

uint32_t IRContext::GetBuiltinInputVarId(uint32_t builtin) {
  if (!AreAnalysesValid(kAnalysisBuiltinVarId)) ResetBuiltinAnalysis();
  // If cached, return it.
  std::unordered_map<uint32_t, uint32_t>::iterator it =
      builtin_var_id_map_.find(builtin);
  if (it != builtin_var_id_map_.end()) return it->second;
  // Look for one in shader
  uint32_t var_id = FindBuiltinInputVar(builtin);
  if (var_id == 0) {
    // If not found, create it
    // TODO(greg-lunarg): Add support for all builtins
    analysis::TypeManager* type_mgr = get_type_mgr();
    analysis::Type* reg_type;
    switch (spv::BuiltIn(builtin)) {
      case spv::BuiltIn::FragCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v4float_ty(reg_float_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4float_ty);
        break;
      }
      case spv::BuiltIn::VertexIndex:
      case spv::BuiltIn::InstanceIndex:
      case spv::BuiltIn::PrimitiveId:
      case spv::BuiltIn::InvocationId:
      case spv::BuiltIn::SubgroupLocalInvocationId: {
        analysis::Integer uint_ty(32, false);
        reg_type = type_mgr->GetRegisteredType(&uint_ty);
        break;
      }
      case spv::BuiltIn::GlobalInvocationId:
      case spv::BuiltIn::LaunchIdNV: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v3uint_ty(reg_uint_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3uint_ty);
        break;
      }
      case spv::BuiltIn::TessCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v3float_ty(reg_float_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3float_ty);
        break;
      }
      case spv::BuiltIn::SubgroupLtMask: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v4uint_ty(reg_uint_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4uint_ty);
        break;
      }
      default: {
        assert(false && "unhandled builtin");
        return 0;
      }
    }
    uint32_t type_id = type_mgr->GetTypeInstruction(reg_type);
    uint32_t varTyPtrId =
        type_mgr->FindPointerToType(type_id, spv::StorageClass::Input);
    // TODO(1841): Handle id overflow.
    var_id = TakeNextId();
    std::unique_ptr<Instruction> newVarOp(
        new Instruction(this, spv::Op::OpVariable, varTyPtrId, var_id,
                        {{spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
                          {uint32_t(spv::StorageClass::Input)}}}));
    get_def_use_mgr()->AnalyzeInstDefUse(&*newVarOp);
    module()->AddGlobalValue(std::move(newVarOp));
    get_decoration_mgr()->AddDecorationVal(
        var_id, uint32_t(spv::Decoration::BuiltIn), builtin);
    AddVarToEntryPoints(var_id);
  }
  builtin_var_id_map_[builtin] = var_id;
  return var_id;
}